

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<3,_12,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  float scalar;
  Type in0;
  MatrixCaseUtils local_a4 [12];
  Mat4x3 local_98;
  VecAccess<float,_4,_3> local_68;
  Matrix<float,_3,_4> local_50;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,12>(&local_98,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_4>::Matrix(&local_98,(float *)s_constInMat4x3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  tcu::operator/(&local_50,&local_98,scalar);
  reduceToVec3(local_a4,&local_50);
  local_68.m_vector = &evalCtx->color;
  local_68.m_index[0] = 0;
  local_68.m_index[1] = 1;
  local_68.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_68,(Vector<float,_3> *)local_a4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}